

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::BaseEmitter::commentf(BaseEmitter *this,char *fmt,...)

{
  char in_AL;
  Error _err;
  Error EVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong uVar2;
  undefined1 *puVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_4e8 [16];
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined4 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  ulong uStack_430;
  undefined8 local_428;
  undefined1 *local_420;
  undefined1 local_418 [1032];
  
  if (in_AL != '\0') {
    local_4b8 = in_XMM0_Da;
    local_4a8 = in_XMM1_Qa;
    local_498 = in_XMM2_Qa;
    local_488 = in_XMM3_Qa;
    local_478 = in_XMM4_Qa;
    local_468 = in_XMM5_Qa;
    local_458 = in_XMM6_Qa;
    local_448 = in_XMM7_Qa;
  }
  local_4d8 = in_RDX;
  local_4d0 = in_RCX;
  local_4c8 = in_R8;
  local_4c0 = in_R9;
  if ((this->_emitterFlags & kLogComments) == kNone) {
    EVar1 = 0;
    if ((this->_emitterFlags & kAttached) == kNone) {
      EVar1 = 5;
      reportError(this,5,(char *)0x0);
    }
  }
  else {
    local_420 = local_418;
    uStack_430 = 0;
    local_438 = 0x20;
    local_428 = 0x407;
    local_418[0] = 0;
    ap[0].reg_save_area = local_4e8;
    ap[0].overflow_arg_area = &stack0x00000008;
    ap[0].gp_offset = 0x10;
    ap[0].fp_offset = 0x30;
    EVar1 = String::_opVFormat((String *)&local_438,kAppend,fmt,ap);
    if (EVar1 == 0) {
      uVar2 = uStack_430;
      puVar3 = local_420;
      if ((local_438 & 0xff) < 0x1f) {
        uVar2 = local_438 & 0xff;
        puVar3 = (undefined1 *)((long)&local_438 + 1);
      }
      EVar1 = (*this->_vptr_BaseEmitter[0xf])(this,puVar3,uVar2);
    }
    String::reset((String *)&local_438);
  }
  return EVar1;
}

Assistant:

Error BaseEmitter::commentf(const char* fmt, ...) {
  if (!hasEmitterFlag(EmitterFlags::kLogComments)) {
    if (!hasEmitterFlag(EmitterFlags::kAttached))
      return reportError(DebugUtils::errored(kErrorNotInitialized));
    return kErrorOk;
  }

#ifndef ASMJIT_NO_LOGGING
  StringTmp<1024> sb;

  va_list ap;
  va_start(ap, fmt);
  Error err = sb.appendVFormat(fmt, ap);
  va_end(ap);

  ASMJIT_PROPAGATE(err);
  return comment(sb.data(), sb.size());
#else
  DebugUtils::unused(fmt);
  return kErrorOk;
#endif
}